

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

void cpu_change_pstate_sparc64(CPUSPARCState_conflict2 *env,uint32_t new_pstate)

{
  uint pstate;
  uint64_t *src_00;
  uint64_t *dst_00;
  uint64_t *dst;
  uint64_t *src;
  uint32_t new_pstate_regs;
  uint32_t pstate_regs;
  uint32_t new_pstate_local;
  CPUSPARCState_conflict2 *env_local;
  
  if (((env->def).features & 0x2000) == 0) {
    pstate = env->pstate & 0xc01;
    if ((new_pstate & 0xc01) != pstate) {
      src_00 = get_gregset(env,new_pstate & 0xc01);
      dst_00 = get_gregset(env,pstate);
      memcpy32(dst_00,env->gregs);
      memcpy32(env->gregs,src_00);
    }
    env->pstate = new_pstate;
  }
  else {
    env->pstate = new_pstate & 0xfffff3fe;
  }
  return;
}

Assistant:

void cpu_change_pstate(CPUSPARCState *env, uint32_t new_pstate)
{
    uint32_t pstate_regs, new_pstate_regs;
    uint64_t *src, *dst;

    if (env->def.features & CPU_FEATURE_GL) {
        /* PS_AG, IG and MG are not implemented in this case */
        new_pstate &= ~(PS_AG | PS_IG | PS_MG);
        env->pstate = new_pstate;
        return;
    }

    pstate_regs = env->pstate & 0xc01;
    new_pstate_regs = new_pstate & 0xc01;

    if (new_pstate_regs != pstate_regs) {
        /* Switch global register bank */
        src = get_gregset(env, new_pstate_regs);
        dst = get_gregset(env, pstate_regs);
        memcpy32(dst, env->gregs);
        memcpy32(env->gregs, src);
    }
    env->pstate = new_pstate;
}